

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fGeometryShaderTests.cpp
# Opt level: O3

void __thiscall
deqp::gles31::Functional::anon_unknown_1::GeometryShaderRenderTest::renderWithContext
          (GeometryShaderRenderTest *this,Context *ctx,ShaderProgram *program,Surface *dstSurface)

{
  pointer pVVar1;
  pointer puVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  deUint32 dVar6;
  uint uVar7;
  GLuint elementArrayBuf;
  GLuint vertexAttrBuf;
  GLuint vertexPosBuf;
  GLuint vaoId;
  uint local_48;
  uint local_44;
  uint local_40;
  uint local_3c;
  Surface *local_38;
  
  local_38 = dstSurface;
  uVar3 = (*ctx->_vptr_Context[0x75])(ctx,program);
  uVar4 = (*ctx->_vptr_Context[0x59])(ctx,(ulong)uVar3,"a_position");
  uVar5 = (*ctx->_vptr_Context[0x59])(ctx,(ulong)uVar3,this->m_dataAttributeName);
  local_3c = 0;
  local_40 = 0;
  local_44 = 0;
  local_48 = 0;
  (*ctx->_vptr_Context[0x4c])(ctx,1,&local_3c);
  (*ctx->_vptr_Context[0x4b])(ctx,(ulong)local_3c);
  if (uVar4 != 0xffffffff) {
    (*ctx->_vptr_Context[0x26])(ctx,1,&local_40);
    (*ctx->_vptr_Context[0x25])(ctx,0x8892,(ulong)local_40);
    pVVar1 = (this->m_vertexPosData).
             super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
             _M_impl.super__Vector_impl_data._M_start;
    (*ctx->_vptr_Context[0x28])
              (ctx,0x8892,
               (long)(this->m_vertexPosData).
                     super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish - (long)pVVar1,pVVar1,0x88e4);
    (*ctx->_vptr_Context[0x4e])(ctx,(ulong)uVar4,4,0x1406,0,0,0);
    (*ctx->_vptr_Context[0x50])(ctx,(ulong)uVar4);
  }
  if (uVar5 != 0xffffffff) {
    (*ctx->_vptr_Context[0x26])(ctx,1,&local_44);
    (*ctx->_vptr_Context[0x25])(ctx,0x8892,(ulong)local_44);
    pVVar1 = (this->m_vertexAttrData).
             super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
             _M_impl.super__Vector_impl_data._M_start;
    (*ctx->_vptr_Context[0x28])
              (ctx,0x8892,
               (long)(this->m_vertexAttrData).
                     super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish - (long)pVVar1,pVVar1,0x88e4);
    (*ctx->_vptr_Context[0x4e])(ctx,(ulong)uVar5,4,0x1406,0,0,0);
    (*ctx->_vptr_Context[0x50])(ctx,(ulong)uVar5);
    if (this->m_vertexAttrDivisor != 0) {
      (*ctx->_vptr_Context[0x52])(ctx,(ulong)uVar5);
    }
  }
  if ((this->m_flags & 2) != 0) {
    (*ctx->_vptr_Context[0x26])(ctx,1,&local_48);
    (*ctx->_vptr_Context[0x25])(ctx,0x8893,(ulong)local_48);
    puVar2 = (this->m_indices).super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
             _M_impl.super__Vector_impl_data._M_start;
    (*ctx->_vptr_Context[0x28])
              (ctx,0x8893,
               (long)(this->m_indices).
                     super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
                     super__Vector_impl_data._M_finish - (long)puVar2,puVar2,0x88e4);
  }
  (*ctx->_vptr_Context[0x2a])(0,0,0,0x3f800000,ctx);
  (*ctx->_vptr_Context[0x2d])(ctx);
  (*ctx->_vptr_Context[5])
            (ctx,0,0,(ulong)(uint)(this->m_viewportSize).m_data[0],
             (ulong)(uint)(this->m_viewportSize).m_data[1]);
  dVar6 = (*ctx->_vptr_Context[0x79])(ctx);
  glu::checkError(dVar6,(char *)0x0,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fGeometryShaderTests.cpp"
                  ,0x82f);
  (*ctx->_vptr_Context[0x76])(ctx);
  dVar6 = (*ctx->_vptr_Context[0x79])(ctx);
  glu::checkError(dVar6,(char *)0x0,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fGeometryShaderTests.cpp"
                  ,0x832);
  (*(this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode[7])(this,ctx,(ulong)uVar3);
  dVar6 = (*ctx->_vptr_Context[0x79])(ctx);
  glu::checkError(dVar6,(char *)0x0,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fGeometryShaderTests.cpp"
                  ,0x835);
  uVar7 = this->m_flags;
  if ((uVar7 & 4) != 0) {
    (*ctx->_vptr_Context[0x33])(ctx);
    dVar6 = (*ctx->_vptr_Context[0x79])(ctx);
    glu::checkError(dVar6,(char *)0x0,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fGeometryShaderTests.cpp"
                    ,0x83a);
    uVar7 = this->m_flags;
  }
  if ((uVar7 & 2) == 0) {
    if ((uVar7 & 1) == 0) {
      (*ctx->_vptr_Context[0x68])(ctx,(ulong)this->m_inputPrimitives,0);
    }
    else {
      (*ctx->_vptr_Context[0x69])
                (ctx,(ulong)this->m_inputPrimitives,0,(ulong)(uint)this->m_numDrawVertices,
                 (ulong)(uint)this->m_numDrawInstances);
    }
  }
  else {
    (*ctx->_vptr_Context[0x6a])
              (ctx,(ulong)this->m_inputPrimitives,(ulong)(uint)this->m_numDrawVertices,0x1403,0);
  }
  dVar6 = (*ctx->_vptr_Context[0x79])(ctx);
  glu::checkError(dVar6,(char *)0x0,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fGeometryShaderTests.cpp"
                  ,0x844);
  if ((this->m_flags & 4) != 0) {
    (*ctx->_vptr_Context[0x34])(ctx);
    dVar6 = (*ctx->_vptr_Context[0x79])(ctx);
    glu::checkError(dVar6,(char *)0x0,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fGeometryShaderTests.cpp"
                    ,0x849);
  }
  (*(this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode[8])(this,ctx,(ulong)uVar3);
  dVar6 = (*ctx->_vptr_Context[0x79])(ctx);
  glu::checkError(dVar6,(char *)0x0,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fGeometryShaderTests.cpp"
                  ,0x84d);
  (*ctx->_vptr_Context[0x76])(ctx,0);
  if (uVar4 != 0xffffffff) {
    (*ctx->_vptr_Context[0x51])(ctx,(ulong)uVar4);
  }
  if (uVar5 != 0xffffffff) {
    (*ctx->_vptr_Context[0x51])(ctx,(ulong)uVar5);
  }
  if (local_40 != 0) {
    (*ctx->_vptr_Context[0x27])(ctx,1,&local_40);
  }
  if (local_44 != 0) {
    (*ctx->_vptr_Context[0x27])(ctx,1,&local_44);
  }
  if (local_48 != 0) {
    (*ctx->_vptr_Context[0x27])(ctx,1,&local_48);
  }
  (*ctx->_vptr_Context[0x4d])(ctx,1,&local_3c);
  dVar6 = (*ctx->_vptr_Context[0x79])(ctx);
  glu::checkError(dVar6,(char *)0x0,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fGeometryShaderTests.cpp"
                  ,0x85f);
  (*ctx->_vptr_Context[0x7a])(ctx);
  (*ctx->_vptr_Context[0x80])
            (ctx,local_38,0,0,(ulong)(uint)(this->m_viewportSize).m_data[0],
             (ulong)(uint)(this->m_viewportSize).m_data[1]);
  return;
}

Assistant:

void GeometryShaderRenderTest::renderWithContext (sglr::Context& ctx, sglr::ShaderProgram& program, tcu::Surface& dstSurface)
{
#define CHECK_GL_CTX_ERRORS() glu::checkError(ctx.getError(), DE_NULL, __FILE__, __LINE__)

	const GLuint	programId		= ctx.createProgram(&program);
	const GLint		attrPosLoc		= ctx.getAttribLocation(programId, "a_position");
	const GLint		attrColLoc		= ctx.getAttribLocation(programId, m_dataAttributeName);
	GLuint			vaoId			= 0;
	GLuint			vertexPosBuf	= 0;
	GLuint			vertexAttrBuf	= 0;
	GLuint			elementArrayBuf	= 0;

	ctx.genVertexArrays(1, &vaoId);
	ctx.bindVertexArray(vaoId);

	if (attrPosLoc != -1)
	{
		ctx.genBuffers(1, &vertexPosBuf);
		ctx.bindBuffer(GL_ARRAY_BUFFER, vertexPosBuf);
		ctx.bufferData(GL_ARRAY_BUFFER, m_vertexPosData.size() * sizeof(tcu::Vec4), &m_vertexPosData[0], GL_STATIC_DRAW);
		ctx.vertexAttribPointer(attrPosLoc, 4, GL_FLOAT, GL_FALSE, 0, DE_NULL);
		ctx.enableVertexAttribArray(attrPosLoc);
	}

	if (attrColLoc != -1)
	{
		ctx.genBuffers(1, &vertexAttrBuf);
		ctx.bindBuffer(GL_ARRAY_BUFFER, vertexAttrBuf);
		ctx.bufferData(GL_ARRAY_BUFFER, m_vertexAttrData.size() * sizeof(tcu::Vec4), &m_vertexAttrData[0], GL_STATIC_DRAW);
		ctx.vertexAttribPointer(attrColLoc, 4, GL_FLOAT, GL_FALSE, 0, DE_NULL);
		ctx.enableVertexAttribArray(attrColLoc);

		if (m_vertexAttrDivisor)
			ctx.vertexAttribDivisor(attrColLoc, m_vertexAttrDivisor);
	}

	if (m_flags & FLAG_USE_INDICES)
	{
		ctx.genBuffers(1, &elementArrayBuf);
		ctx.bindBuffer(GL_ELEMENT_ARRAY_BUFFER, elementArrayBuf);
		ctx.bufferData(GL_ELEMENT_ARRAY_BUFFER, m_indices.size() * sizeof(deUint16), &m_indices[0], GL_STATIC_DRAW);
	}

	ctx.clearColor(0, 0, 0, 1);
	ctx.clear(GL_COLOR_BUFFER_BIT);

	ctx.viewport(0, 0, m_viewportSize.x(), m_viewportSize.y());
	CHECK_GL_CTX_ERRORS();

	ctx.useProgram(programId);
	CHECK_GL_CTX_ERRORS();

	preRender(ctx, programId);
	CHECK_GL_CTX_ERRORS();

	if (m_flags & FLAG_USE_RESTART_INDEX)
	{
		ctx.enable(GL_PRIMITIVE_RESTART_FIXED_INDEX);
		CHECK_GL_CTX_ERRORS();
	}

	if (m_flags & FLAG_USE_INDICES)
		ctx.drawElements(m_inputPrimitives, m_numDrawVertices, GL_UNSIGNED_SHORT, DE_NULL);
	else if (m_flags & FLAG_DRAW_INSTANCED)
		ctx.drawArraysInstanced(m_inputPrimitives, 0, m_numDrawVertices, m_numDrawInstances);
	else
		ctx.drawArrays(m_inputPrimitives, 0, m_numDrawVertices);

	CHECK_GL_CTX_ERRORS();

	if (m_flags & FLAG_USE_RESTART_INDEX)
	{
		ctx.disable(GL_PRIMITIVE_RESTART_FIXED_INDEX);
		CHECK_GL_CTX_ERRORS();
	}

	postRender(ctx, programId);
	CHECK_GL_CTX_ERRORS();

	ctx.useProgram(0);

	if (attrPosLoc != -1)
		ctx.disableVertexAttribArray(attrPosLoc);
	if (attrColLoc != -1)
		ctx.disableVertexAttribArray(attrColLoc);

	if (vertexPosBuf)
		ctx.deleteBuffers(1, &vertexPosBuf);
	if (vertexAttrBuf)
		ctx.deleteBuffers(1, &vertexAttrBuf);
	if (elementArrayBuf)
		ctx.deleteBuffers(1, &elementArrayBuf);

	ctx.deleteVertexArrays(1, &vaoId);

	CHECK_GL_CTX_ERRORS();

	ctx.finish();
	ctx.readPixels(dstSurface, 0, 0, m_viewportSize.x(), m_viewportSize.y());

#undef CHECK_GL_CTX_ERRORS
}